

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

int filter_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count,
                  int *out_stones)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  pthread_t pVar4;
  long lVar5;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  CManager in_RDI;
  uint *in_R9;
  timespec ts_1;
  timespec ts;
  ev_state_data ev_state;
  cod_exec_context ec;
  int ret;
  response_instance_conflict instance;
  event_item *in_stack_ffffffffffffff30;
  FILE *__stream;
  undefined8 in_stack_ffffffffffffff38;
  CManager_conflict in_stack_ffffffffffffff40;
  timespec local_b0;
  __time_t local_a0;
  undefined4 local_98;
  CMTraceType in_stack_ffffffffffffff6c;
  CManager p_Var6;
  uint local_3c;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  lVar5 = *(long *)(in_RDX + 0x20);
  p_Var6 = in_RDI;
  if (lVar5 == 0) {
    local_3c = (**(code **)(in_RDX + 0x10))(*(undefined8 *)(in_RSI + 0x20),in_RCX);
  }
  else {
    cod_assoc_client_data(lVar5,0x34567890,&stack0xffffffffffffff70);
    local_3c = (*(code *)**(undefined8 **)(in_RDX + 0x18))
                         (lVar5,*(undefined8 *)(in_RSI + 0x20),in_RCX);
  }
  if (local_3c == 0) {
    iVar3 = CMtrace_val[10];
    if (in_RDI->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(p_Var6,in_stack_ffffffffffffff6c);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)in_RDI->CMTrace_file;
        _Var2 = getpid();
        lVar5 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",lVar5,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_b0);
        fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",local_b0.tv_sec,local_b0.tv_nsec);
      }
      fprintf((FILE *)in_RDI->CMTrace_file,"Filter function returned %d, NOT submitting\n",0);
    }
    fflush((FILE *)in_RDI->CMTrace_file);
  }
  else {
    iVar1 = CMtrace_val[10];
    if (in_RDI->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(p_Var6,in_stack_ffffffffffffff6c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff40 = (CManager_conflict)in_RDI->CMTrace_file;
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf((FILE *)in_stack_ffffffffffffff40,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_a0);
        fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",local_a0,
                CONCAT44(in_stack_ffffffffffffff6c,local_98));
      }
      fprintf((FILE *)in_RDI->CMTrace_file,
              "Filter function returned %d, submitting further to stone %d\n",(ulong)local_3c,
              (ulong)*in_R9);
    }
    fflush((FILE *)in_RDI->CMTrace_file);
    internal_path_submit(in_stack_ffffffffffffff40,iVar3,in_stack_ffffffffffffff30);
  }
  return local_3c;
}

Assistant:

static int
filter_wrapper(CManager cm, struct _event_item *event, void *client_data,
	       attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    cod_exec_context ec = instance->u.filter.ec;
    struct ev_state_data ev_state;

    ev_state.cm = cm;
    ev_state.cur_event = event;
    ev_state.out_count = out_count;
    ev_state.out_stones = out_stones;
    if (ec != NULL) {
#ifdef HAVE_COD_H
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);

	ret = ((int(*)(cod_exec_context, void *, attr_list))instance->u.filter.code->func)(ec, event->decoded_event, attrs);
#endif
    } else {
	/* DLL-based handler */
	ret = ((int(*)(void *, attr_list))instance->u.filter.func_ptr)(event->decoded_event, attrs);
    }
    if (ret) {
	CMtrace_out(cm, EVerbose, "Filter function returned %d, submitting further to stone %d\n", ret, out_stones[0]);
	internal_path_submit(cm, out_stones[0], event);
    } else {
	CMtrace_out(cm, EVerbose, "Filter function returned %d, NOT submitting\n", ret);
    }
    return ret;
}